

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall
fasttext::Dictionary::addSubwords
          (Dictionary *this,vector<int,_std::allocator<int>_> *line,string_view token,int32_t wid)

{
  iterator __position;
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  size_t __n;
  size_type __rlen;
  string concat;
  int32_t local_4c;
  string local_48;
  
  __n = token._M_len;
  local_4c = wid;
  if (-1 < wid) {
    if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            maxn) {
      pvVar2 = getSubwords(this,wid);
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)line,
                 (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      return;
    }
    __position._M_current =
         (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current !=
        (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      *__position._M_current = wid;
      (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
      return;
    }
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)line,__position,&local_4c);
    return;
  }
  if (DAT_0014c470 == __n) {
    if (__n == 0) {
      return;
    }
    iVar1 = bcmp(token._M_str,EOS_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return;
    }
  }
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::reserve((ulong)&local_48);
  std::__cxx11::string::_M_append((char *)&local_48,BOW_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_48,(ulong)token._M_str);
  std::__cxx11::string::_M_append((char *)&local_48,EOW_abi_cxx11_);
  computeSubwords(this,&local_48,line,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Dictionary::addSubwords(
    std::vector<int32_t>& line,
    const std::string_view token,
    int32_t wid) const {
  if (wid < 0) { // out of vocab
    if (token != EOS) {
      std::string concat;
      concat.reserve(BOW.size() + token.size() + EOW.size());
      concat += BOW;
      concat.append(token.data(), token.size());
      concat += EOW;
      computeSubwords(concat, line);
    }
  } else {
    if (args_->maxn <= 0) { // in vocab w/o subwords
      line.push_back(wid);
    } else { // in vocab w/ subwords
      const std::vector<int32_t>& ngrams = getSubwords(wid);
      line.insert(line.end(), ngrams.cbegin(), ngrams.cend());
    }
  }
}